

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O0

int CfdGetAddressFromLockingScript
              (void *handle,char *locking_script,int network_type,char **address)

{
  bool bVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined8 *in_RCX;
  char *in_RSI;
  CfdException *except;
  exception *std_except;
  ElementsAddressFactory elements_factory;
  AddressFactory address_factory;
  Address addr;
  Script script;
  NetType net_type;
  bool is_bitcoin;
  int error_code;
  NetType in_stack_fffffffffffff99c;
  Address *in_stack_fffffffffffff9a0;
  string *in_stack_fffffffffffff9b0;
  undefined8 in_stack_fffffffffffff9b8;
  CfdError error_code_00;
  CfdException *in_stack_fffffffffffff9c0;
  allocator *paVar4;
  undefined8 in_stack_fffffffffffff9d8;
  NetType type;
  ElementsAddressFactory *in_stack_fffffffffffff9e0;
  bool *in_stack_fffffffffffff9f8;
  undefined4 in_stack_fffffffffffffa00;
  int in_stack_fffffffffffffa04;
  string local_5f8 [11];
  Script *in_stack_fffffffffffffb80;
  AddressFactory *in_stack_fffffffffffffb88;
  Address local_438;
  Address local_298;
  allocator local_119;
  string local_118;
  Script local_f8;
  NetType local_c0;
  byte local_bb;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  CfdSourceLocation local_98;
  undefined1 local_7a;
  allocator local_79;
  string local_78 [32];
  CfdSourceLocation local_58;
  undefined4 local_2c;
  undefined8 *local_28;
  char *local_18;
  int local_4;
  
  type = (NetType)((ulong)in_stack_fffffffffffff9d8 >> 0x20);
  error_code_00 = (CfdError)((ulong)in_stack_fffffffffffff9b8 >> 0x20);
  local_2c = 0xffffffff;
  local_28 = in_RCX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (bVar1) {
    local_58.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_address.cpp"
                 ,0x2f);
    local_58.filename = local_58.filename + 1;
    local_58.line = 0x403;
    local_58.funcname = "CfdGetAddressFromLockingScript";
    cfd::core::logger::warn<>(&local_58,"lockingScript is null or empty.");
    local_7a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_78,"Failed to parameter. lockingScript is null or empty.",&local_79);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff9c0,error_code_00,in_stack_fffffffffffff9b0);
    local_7a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_28 == (undefined8 *)0x0) {
    local_98.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_address.cpp"
                 ,0x2f);
    local_98.filename = local_98.filename + 1;
    local_98.line = 0x409;
    local_98.funcname = "CfdGetAddressFromLockingScript";
    cfd::core::logger::warn<>(&local_98,"address is null.");
    local_ba = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    paVar4 = &local_b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"Failed to parameter. address is null.",paVar4);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff9c0,error_code_00,in_stack_fffffffffffff9b0);
    local_ba = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_bb = 0;
  local_c0 = cfd::capi::ConvertNetType(in_stack_fffffffffffffa04,in_stack_fffffffffffff9f8);
  paVar4 = &local_119;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,local_18,paVar4);
  cfd::core::Script::Script(&local_f8,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  cfd::core::Address::Address(&local_298);
  if ((local_bb & 1) == 0) {
    cfd::ElementsAddressFactory::ElementsAddressFactory(in_stack_fffffffffffff9e0,type);
    cfd::AddressFactory::GetAddressByLockingScript
              (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    cfd::core::Address::operator=(&local_298,(Address *)(local_5f8 + 1));
    cfd::core::Address::~Address(in_stack_fffffffffffff9a0);
    cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x5860a2);
  }
  else {
    cfd::AddressFactory::AddressFactory
              ((AddressFactory *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff99c);
    cfd::AddressFactory::GetAddressByLockingScript
              (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    cfd::core::Address::operator=(&local_298,&local_438);
    cfd::core::Address::~Address(in_stack_fffffffffffff9a0);
    cfd::AddressFactory::~AddressFactory((AddressFactory *)0x585f73);
  }
  cfd::core::Address::GetAddress_abi_cxx11_(local_5f8,&local_298);
  pcVar3 = cfd::capi::CreateString
                     ((string *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
  *local_28 = pcVar3;
  std::__cxx11::string::~string((string *)local_5f8);
  local_4 = 0;
  cfd::core::Address::~Address(in_stack_fffffffffffff9a0);
  cfd::core::Script::~Script((Script *)in_stack_fffffffffffff9a0);
  return local_4;
}

Assistant:

int CfdGetAddressFromLockingScript(
    void* handle, const char* locking_script, int network_type,
    char** address) {
  int error_code = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(locking_script)) {
      warn(CFD_LOG_SOURCE, "lockingScript is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. lockingScript is null or empty.");
    }
    if (address == nullptr) {
      warn(CFD_LOG_SOURCE, "address is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. address is null.");
    }

    bool is_bitcoin = false;
    NetType net_type = cfd::capi::ConvertNetType(network_type, &is_bitcoin);
    Script script = Script(locking_script);
    Address addr;

    if (is_bitcoin) {
      AddressFactory address_factory(net_type);
      addr = address_factory.GetAddressByLockingScript(script);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ElementsAddressFactory elements_factory(net_type);
      addr = elements_factory.GetAddressByLockingScript(script);
#else
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Elements not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    *address = CreateString(addr.GetAddress());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    error_code = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return error_code;
}